

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-and-recv.c
# Opt level: O3

void alloc_cb(uv_handle_t *handle,size_t suggested_size,uv_buf_t *buf)

{
  int iVar1;
  bool bVar2;
  undefined8 *extraout_RDX;
  uv_close_cb p_Var3;
  uv_handle_t *handle_01;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_48 [16];
  uv_close_cb p_Stack_38;
  uv_close_cb p_Stack_30;
  undefined8 local_10;
  void *local_8;
  uv_udp_t *handle_00;
  
  bVar2 = (uv_udp_t *)handle == &client || (uv_udp_t *)handle == &server;
  handle_00 = (uv_udp_t *)CONCAT71(0x1059a,bVar2);
  local_8 = (void *)(ulong)bVar2;
  local_10._0_4_ = 0;
  local_10._4_4_ = 0;
  if (local_8 == (void *)0x0) {
    alloc_cb_cold_2();
  }
  else {
    local_10._0_4_ = 0x10000;
    local_10._4_4_ = 0;
    local_8 = (void *)suggested_size;
    if ((long)suggested_size < 0x10001) {
      buf->base = alloc_cb::slab;
      buf->len = 0x10000;
      return;
    }
  }
  handle_01 = (uv_handle_t *)&stack0xfffffffffffffff8;
  p_Var3 = (uv_close_cb)&local_10;
  alloc_cb_cold_1();
  p_Stack_38 = (uv_close_cb)0x0;
  p_Stack_30 = p_Var3;
  if ((long)p_Var3 < 1) {
    auStack_48._0_8_ = (void *)0x1df645;
    sv_recv_cb_cold_1();
LAB_001df645:
    auStack_48._0_8_ = (void *)0x1df654;
    sv_recv_cb_cold_2();
LAB_001df654:
    auStack_48._0_8_ = (void *)0x1df659;
    sv_recv_cb_cold_4();
  }
  else {
    if (p_Var3 == (uv_close_cb)0x0) {
      if (handle_00 == (uv_udp_t *)0x0) {
        return;
      }
      goto LAB_001df668;
    }
    p_Stack_30 = (uv_close_cb)0x4;
    p_Stack_38 = p_Var3;
    if (p_Var3 != (uv_close_cb)0x4) goto LAB_001df645;
    if (handle_00 == (uv_udp_t *)0x0) goto LAB_001df654;
    auStack_48._0_8_ = (void *)0x1df5e4;
    iVar1 = memcmp("EXIT",(void *)*extraout_RDX,4);
    p_Stack_30 = (uv_close_cb)(long)iVar1;
    p_Stack_38 = (uv_close_cb)0x0;
    if (p_Stack_30 == (uv_close_cb)0x0) {
      auStack_48._0_8_ = (void *)0x1df612;
      uv_close(handle_01,close_cb);
      auStack_48._0_8_ = (void *)0x1df621;
      uv_close((uv_handle_t *)&client,close_cb);
      sv_recv_cb_called = sv_recv_cb_called + 1;
      return;
    }
  }
  auStack_48._0_8_ = (void *)0x1df668;
  sv_recv_cb_cold_3();
LAB_001df668:
  auStack_48._0_8_ = close_cb;
  sv_recv_cb_cold_5();
  auStack_48._0_8_ = ZEXT18(handle_00 == &client || handle_00 == &server);
  if ((void *)auStack_48._0_8_ == (void *)0x0) {
    handle_00 = (uv_udp_t *)auStack_48;
    close_cb_cold_2();
  }
  else {
    iVar1 = uv_is_closing((uv_handle_t *)handle_00);
    if (iVar1 != 0) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)handle_00);
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)handle_00,(uv_close_cb)0x0);
    return;
  }
  return;
}

Assistant:

static void alloc_cb(uv_handle_t* handle,
                     size_t suggested_size,
                     uv_buf_t* buf) {
  static char slab[65536];
  CHECK_HANDLE(handle);
  ASSERT_LE(suggested_size, sizeof(slab));
  buf->base = slab;
  buf->len = sizeof(slab);
}